

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfile.cpp
# Opt level: O2

int __thiscall QFile::remove(QFile *this,char *__filename)

{
  QFileDevicePrivate *this_00;
  char cVar1;
  int iVar2;
  FileError FVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long in_FS_OFFSET;
  QMessageLogger local_38;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QFileDevicePrivate *)(this->super_QFileDevice).super_QIODevice.super_QObject.d_ptr.d;
  if (this_00[1].super_QIODevicePrivate.super_QObjectPrivate.super_QObjectData.parent ==
      (QObject *)0x0) {
    iVar2 = (*(this_00->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.
              _vptr_QObjectData[7])(this_00);
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x140))
                      ((long *)CONCAT44(extraout_var,iVar2));
    if (cVar1 == '\0') {
      local_38.context.version = 2;
      local_38.context.function._4_4_ = 0;
      local_38.context._4_8_ = 0;
      local_38.context._12_8_ = 0;
      local_38.context.category = "default";
      iVar2 = 0;
      QMessageLogger::warning(&local_38,"QFile::remove: Empty or null file name");
      goto LAB_0021e530;
    }
  }
  QFileDevice::unsetError(&this->super_QFileDevice);
  (*(this->super_QFileDevice).super_QIODevice.super_QObject._vptr_QObject[0xe])(this);
  FVar3 = QFileDevice::error(&this->super_QFileDevice);
  if (FVar3 == NoError) {
    iVar2 = (*(this_00->super_QIODevicePrivate).super_QObjectPrivate.super_QObjectData.
              _vptr_QObjectData[7])(this_00);
    cVar1 = (**(code **)(*(long *)CONCAT44(extraout_var_00,iVar2) + 0x50))
                      ((long *)CONCAT44(extraout_var_00,iVar2));
    if (cVar1 != '\0') {
      QFileDevice::unsetError(&this->super_QFileDevice);
      iVar2 = (int)CONCAT71((int7)((ulong)this_00 >> 8),1);
      goto LAB_0021e530;
    }
    QAbstractFileEngine::errorString
              ((QString *)&local_38,
               (QAbstractFileEngine *)
               (this_00->fileEngine)._M_t.
               super___uniq_ptr_impl<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
               ._M_t.
               super__Tuple_impl<0UL,_QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>
               .super__Head_base<0UL,_QAbstractFileEngine_*,_false>);
    QFileDevicePrivate::setError(this_00,RemoveError,(QString *)&local_38);
    QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_38);
  }
  iVar2 = 0;
LAB_0021e530:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return iVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool
QFile::remove()
{
    Q_D(QFile);
    if (d->fileName.isEmpty() &&
            !static_cast<QFSFileEngine *>(d->engine())->isUnnamedFile()) {
        qWarning("QFile::remove: Empty or null file name");
        return false;
    }
    unsetError();
    close();
    if (error() == QFile::NoError) {
        if (d->engine()->remove()) {
            unsetError();
            return true;
        }
        d->setError(QFile::RemoveError, d->fileEngine->errorString());
    }
    return false;
}